

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::getSymbolId
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Builder *pBVar1;
  unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
  *this_00;
  mapped_type mVar2;
  ulong uVar3;
  TIntermediate *pTVar4;
  pointer pDVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  BuiltIn num;
  Id IVar9;
  Id IVar10;
  Id IVar11;
  StorageClass SVar12;
  Decoration DVar13;
  undefined4 extraout_var;
  iterator iVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar15;
  undefined4 extraout_var_03;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  long lVar18;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined8 *puVar19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TQualifier *pTVar20;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  long *plVar21;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  bool forwardReferenceOnly;
  uint uVar22;
  char *name;
  Capability CVar23;
  char *pcVar24;
  pointer pDVar25;
  byte bVar26;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> topLevelDecorations;
  TQualifier typeQualifier;
  
  bVar26 = 0;
  this_00 = &this->symbolValues;
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  typeQualifier.semanticName = (char *)CONCAT44(extraout_var,iVar8);
  iVar14 = std::
           _Hashtable<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&this_00->_M_h,(key_type_conflict2 *)&typeQualifier);
  if (iVar14.super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    return *(Id *)((long)iVar14.
                         super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>.
                         _M_cur + 0x10);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  IVar9 = 0;
  num = TranslateBuiltInDecoration
                  (this,*(uint *)(CONCAT44(extraout_var_00,iVar8) + 8) >> 7 & 0x1ff,false);
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar22 = *(uint *)(CONCAT44(extraout_var_01,iVar8) + 8) >> 7 & 0x1ff;
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  if (uVar22 - 0xb < 5) {
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0xd8))
                      ((long *)CONCAT44(extraout_var_02,iVar8));
    IVar10 = 0;
    if (cVar6 == '\0') {
      pBVar1 = &this->builder;
      IVar9 = spv::Builder::makeUintType(pBVar1,0x20);
      IVar9 = spv::Builder::makeVectorType(pBVar1,IVar9,4);
      IVar10 = spv::Builder::makeUintType(pBVar1,0x40);
    }
  }
  else if ((uVar22 == 0x6d) || (IVar10 = 0, uVar22 == 0x6f)) {
    pBVar1 = &this->builder;
    IVar9 = spv::Builder::makeFloatType(pBVar1,0x20);
    IVar9 = spv::Builder::makeMatrixType(pBVar1,IVar9,4,3);
    IVar10 = spv::Builder::makeFloatType(pBVar1,0x20);
    IVar10 = spv::Builder::makeMatrixType(pBVar1,IVar10,3,4);
  }
  if ((num & ~BuiltInPointSize) == BuiltInObjectToWorldKHR) {
    typeQualifier.semanticName = (char *)CONCAT44(typeQualifier.semanticName._4_4_,num);
    iVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->builtInVariableIds)._M_h,(key_type *)&typeQualifier);
    if (iVar15.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      mVar2 = *(mapped_type *)
               ((long)iVar15.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
      topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(topLevelDecorations.
                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,mVar2);
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      typeQualifier.semanticName = (char *)CONCAT44(extraout_var_03,iVar8);
      pmVar16 = std::__detail::
                _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)&typeQualifier);
      *pmVar16 = mVar2;
      if (IVar10 != 0) {
        pmVar17 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->forceType,(key_type *)&topLevelDecorations);
        *pmVar17 = IVar10;
      }
      goto LAB_0033af14;
    }
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar8 == 0x16) {
    return 0;
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar3 = *(ulong *)(CONCAT44(extraout_var_04,iVar8) + 8);
  if (((uVar3 & 0x10000007f) == 2 || (uVar3 >> 0x20 & 1) != 0) &&
     (IVar11 = createSpvConstant(this,&symbol->super_TIntermTyped), IVar11 != 0)) goto LAB_0033a5d6;
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  SVar12 = TranslateStorageClass(this,(TType *)CONCAT44(extraout_var_05,iVar8));
  if (IVar9 == 0) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    IVar9 = convertGlslangToSpvType
                      (this,(TType *)CONCAT44(extraout_var_06,iVar8),forwardReferenceOnly);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar8) + 400))
                    ((long *)CONCAT44(extraout_var_07,iVar8),3);
  if (cVar6 == '\0') {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar7 = glslang::TType::contains16BitInt((TType *)CONCAT44(extraout_var_08,iVar8));
    if (bVar7) goto LAB_0033a222;
    goto LAB_0033a375;
  }
LAB_0033a222:
  switch(SVar12) {
  case Input:
  case Output:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_16bit_storage",Spv_1_3);
    CVar23 = CapabilityStorageInputOutput16;
    break;
  case StorageClassUniform:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_16bit_storage",Spv_1_3);
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_09,iVar8));
    if ((*(uint *)(lVar18 + 8) & 0x7f) == 6) {
      CVar23 = CapabilityStorageBuffer16BitAccess;
    }
    else {
      CVar23 = CapabilityStorageUniform16;
    }
    spv::Builder::addCapability(&this->builder,CVar23);
    goto LAB_0033a375;
  case StorageClassWorkgroup:
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar8) + 0x38))
                      ((long *)CONCAT44(extraout_var_10,iVar8));
    if (iVar8 != 0x10) goto switchD_0033a238_caseD_5;
    CVar23 = CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR;
    break;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    goto switchD_0033a238_caseD_5;
  case PushConstant:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_16bit_storage",Spv_1_3);
    CVar23 = CapabilityStoragePushConstant16;
    break;
  case StorageBuffer:
switchD_0033a238_caseD_c:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_16bit_storage",Spv_1_3);
    CVar23 = CapabilityStorageBuffer16BitAccess;
    break;
  default:
    if (SVar12 == PhysicalStorageBuffer) goto switchD_0033a238_caseD_c;
switchD_0033a238_caseD_5:
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar8) + 400))
                      ((long *)CONCAT44(extraout_var_11,iVar8),3);
    if (cVar6 != '\0') {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar7 = glslang::TType::contains16BitInt((TType *)CONCAT44(extraout_var_12,iVar8));
    if (bVar7) {
      CVar23 = CapabilityInt16;
      break;
    }
    goto LAB_0033a375;
  }
  spv::Builder::addCapability(&this->builder,CVar23);
LAB_0033a375:
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  bVar7 = glslang::TType::contains8BitInt((TType *)CONCAT44(extraout_var_13,iVar8));
  if (bVar7) {
    if (SVar12 == StorageClassUniform) {
      spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_8bit_storage",Spv_1_5);
      CVar23 = CapabilityUniformAndStorageBuffer8BitAccess;
    }
    else if (SVar12 == StorageClassWorkgroup) {
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar8) + 0x38))
                        ((long *)CONCAT44(extraout_var_14,iVar8));
      if (iVar8 == 0x10) {
        CVar23 = CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR;
      }
      else {
LAB_0033a3f0:
        CVar23 = CapabilityInt8;
      }
    }
    else if (SVar12 == StorageBuffer) {
      spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_8bit_storage",Spv_1_5);
      CVar23 = CapabilityStorageBuffer8BitAccess;
    }
    else {
      if (SVar12 != PushConstant) goto LAB_0033a3f0;
      spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_8bit_storage",Spv_1_5);
      CVar23 = CapabilityStoragePushConstant8;
    }
    spv::Builder::addCapability(&this->builder,CVar23);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  pcVar24 = *(char **)(CONCAT44(extraout_var_15,iVar8) + 8);
  topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)glslang::GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &typeQualifier,pcVar24,(pool_allocator<char> *)&topLevelDecorations);
  bVar7 = glslang::IsAnonymous((TString *)&typeQualifier);
  name = "";
  if (!bVar7) {
    name = pcVar24;
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_16,iVar8));
  if (((*(uint *)(lVar18 + 8) & 0x7f) == 5) &&
     ((symbol->constArray).unionArray != (TConstUnionVector *)0x0)) {
    typeQualifier.semanticName = (char *)((ulong)typeQualifier.semanticName & 0xffffffff00000000);
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    IVar11 = createSpvConstantFromConstUnionArray
                       (this,(TType *)CONCAT44(extraout_var_17,iVar8),&symbol->constArray,
                        (int *)&typeQualifier,false);
  }
  else {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_18,iVar8));
    IVar11 = 0;
    if ((*(byte *)(lVar18 + 0xf) & 4) != 0) {
      IVar11 = spv::Builder::makeNullConstant(&this->builder,IVar9);
    }
  }
  IVar11 = spv::Builder::createVariable(&this->builder,DecorationMax,SVar12,IVar9,name,IVar11,false)
  ;
  topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  puVar19 = (undefined8 *)
            (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar8) + 0x58))
                      ((long *)CONCAT44(extraout_var_19,iVar8));
  pTVar20 = &typeQualifier;
  for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
    pTVar20->semanticName = (char *)*puVar19;
    puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
    pTVar20 = (TQualifier *)((long)pTVar20 + (ulong)bVar26 * -0x10 + 8);
  }
  TranslateMemoryDecoration
            (&typeQualifier,&topLevelDecorations,this->glslangIntermediate->useVulkanMemoryModel);
  pDVar5 = topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar25 = topLevelDecorations.
                 super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                 super__Vector_impl_data._M_start; pDVar25 != pDVar5; pDVar25 = pDVar25 + 1) {
    spv::Builder::addDecoration(&this->builder,IVar11,*pDVar25,-1);
  }
  std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
            (&topLevelDecorations.
              super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>);
LAB_0033a5d6:
  topLevelDecorations.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(topLevelDecorations.
                         super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
  if ((num & ~BuiltInPointSize) == BuiltInObjectToWorldKHR) {
    typeQualifier.semanticName = (char *)CONCAT44(IVar11,num);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->builtInVariableIds);
    IVar11 = (Id)topLevelDecorations.
                 super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  typeQualifier.semanticName = (char *)CONCAT44(extraout_var_20,iVar8);
  pmVar16 = std::__detail::
            _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&typeQualifier);
  *pmVar16 = IVar11;
  if (IVar10 != 0) {
    pmVar17 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->forceType,(key_type *)&topLevelDecorations);
    *pmVar17 = IVar10;
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar8 != 0x10) {
    pBVar1 = &this->builder;
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    DVar13 = TranslatePrecisionDecoration((TType *)CONCAT44(extraout_var_21,iVar8));
    spv::Builder::addDecoration(pBVar1,IVar9,DVar13,-1);
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar8) + 0x58))
                        ((long *)CONCAT44(extraout_var_22,iVar8));
    DVar13 = TranslateInterpolationDecoration(this,pTVar20);
    spv::Builder::addDecoration(pBVar1,IVar9,DVar13,-1);
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar8) + 0x58))
                        ((long *)CONCAT44(extraout_var_23,iVar8));
    DVar13 = TranslateAuxiliaryStorageDecoration(this,pTVar20);
    spv::Builder::addDecoration(pBVar1,IVar9,DVar13,-1);
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar8) + 0x58))
                        ((long *)CONCAT44(extraout_var_24,iVar8));
    addMeshNVDecoration(this,IVar9,-1,pTVar20);
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((*(uint *)(CONCAT44(extraout_var_25,iVar8) + 0x1c) & 0x7000) != 0x4000) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,Component,*(uint *)(CONCAT44(extraout_var_26,iVar8) + 0x1c) >> 0xc & 7
                );
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_27,iVar8) + 0x1c) >> 0x30) != -1) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationIndex,
                 (uint)*(byte *)(CONCAT44(extraout_var_28,iVar8) + 0x22));
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_29,iVar8));
    if ((~*(ulong *)(lVar18 + 0x24) & 0x7ff0000000000) != 0) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar8) + 0x58))
                         ((long *)CONCAT44(extraout_var_30,iVar8));
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationSpecId,
                 (uint)((ulong)*(undefined8 *)(lVar18 + 0x24) >> 0x28) & 0x7ff);
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(int *)(CONCAT44(extraout_var_31,iVar8) + 0x14) != -1) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationOffset,*(int *)(CONCAT44(extraout_var_32,iVar8) + 0x14));
    }
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((~*(uint *)(CONCAT44(extraout_var_33,iVar8) + 0x1c) & 0xfff) != 0) {
    if ((this->glslangIntermediate->language - EShLangRayGen < 6) &&
       ((bVar7 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_EXT_ray_tracing"), bVar7 ||
        (bVar7 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_NV_shader_invocation_reorder"), bVar7))))
    {
      pBVar1 = &this->builder;
      SVar12 = spv::Builder::getStorageClass
                         (pBVar1,(Id)topLevelDecorations.
                                     super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      if (SVar12 != RayPayloadKHR) {
        SVar12 = spv::Builder::getStorageClass
                           (pBVar1,(Id)topLevelDecorations.
                                       super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        if (SVar12 != IncomingRayPayloadKHR) {
          SVar12 = spv::Builder::getStorageClass
                             (pBVar1,(Id)topLevelDecorations.
                                         super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          if (SVar12 != CallableDataKHR) {
            SVar12 = spv::Builder::getStorageClass
                               (pBVar1,(Id)topLevelDecorations.
                                           super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
            if (SVar12 != IncomingCallableDataKHR) {
              SVar12 = spv::Builder::getStorageClass
                                 (pBVar1,(Id)topLevelDecorations.
                                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
              if (SVar12 != HitObjectAttributeNV) goto LAB_0033a8cd;
            }
          }
        }
      }
    }
    else {
LAB_0033a8cd:
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (&this->builder,IVar9,DecorationLocation,
                 *(uint *)(CONCAT44(extraout_var_34,iVar8) + 0x1c) & 0xfff);
    }
  }
  pBVar1 = &this->builder;
  IVar9 = (Id)topLevelDecorations.
              super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
              super__Vector_impl_data._M_start;
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_35,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_35,iVar8));
  DVar13 = DecorationInvariant;
  if ((*(uint *)(lVar18 + 8) >> 0x1c & 1) == 0) {
    DVar13 = DecorationMax;
  }
  spv::Builder::addDecoration(pBVar1,IVar9,DVar13,-1);
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(char *)(CONCAT44(extraout_var_36,iVar8) + 0x23) != -1) &&
     (this->glslangIntermediate->multiStream == true)) {
    spv::Builder::addCapability(pBVar1,CapabilityGeometryStreams);
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    spv::Builder::addDecoration
              (pBVar1,IVar9,DecorationStream,(uint)*(byte *)(CONCAT44(extraout_var_37,iVar8) + 0x23)
              );
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(uint *)(CONCAT44(extraout_var_38,iVar8) + 0x1c) & 0x3f8000) == 0x1f8000) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar7 = IsDescriptorResource((TType *)CONCAT44(extraout_var_39,iVar8));
    if (bVar7) {
      uVar22 = 0;
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      goto LAB_0033a9e6;
    }
  }
  else {
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar22 = *(uint *)(CONCAT44(extraout_var_40,iVar8) + 0x1c) >> 0xf & 0x7f;
LAB_0033a9e6:
    spv::Builder::addDecoration(pBVar1,IVar9,DecorationDescriptorSet,uVar22);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((short)((ulong)*(undefined8 *)(CONCAT44(extraout_var_41,iVar8) + 0x1c) >> 0x20) == -1) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar7 = IsDescriptorResource((TType *)CONCAT44(extraout_var_42,iVar8));
    if (bVar7) {
      uVar22 = 0;
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      goto LAB_0033aa49;
    }
  }
  else {
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar22 = (uint)*(ushort *)(CONCAT44(extraout_var_43,iVar8) + 0x20);
LAB_0033aa49:
    spv::Builder::addDecoration(pBVar1,IVar9,Binding,uVar22);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_44,iVar8) + 0x24) >> 0x20) != -1) {
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    spv::Builder::addDecoration
              (pBVar1,IVar9,DecorationInputAttachmentIndex,
               (uint)*(byte *)(CONCAT44(extraout_var_45,iVar8) + 0x28));
  }
  if (this->glslangIntermediate->xfbMode == true) {
    spv::Builder::addCapability(pBVar1,CapabilityTransformFeedback);
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((~*(uint *)(CONCAT44(extraout_var_46,iVar8) + 0x24) & 0xf) != 0) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationXfbBuffer,
                 *(uint *)(CONCAT44(extraout_var_47,iVar8) + 0x24) & 0xf);
      pTVar4 = this->glslangIntermediate;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      uVar22 = (pTVar4->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start
               [(uint)*(undefined8 *)(CONCAT44(extraout_var_48,iVar8) + 0x24) & 0xf].stride;
      if (uVar22 != 0x3fff) {
        spv::Builder::addDecoration
                  (pBVar1,(Id)topLevelDecorations.
                              super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                              _M_impl.super__Vector_impl_data._M_start,DecorationXfbStride,uVar22);
      }
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((~*(uint *)(CONCAT44(extraout_var_49,iVar8) + 0x24) & 0x7ffc0000) != 0) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationOffset,
                 *(uint *)(CONCAT44(extraout_var_50,iVar8) + 0x24) >> 0x12 & 0x1fff);
    }
  }
  if ((num != BuiltInMax) &&
     ((num != BuiltInWorkgroupSize || ((this->glslangIntermediate->spvVersion).spv < 0x10600)))) {
    spv::Builder::addDecoration
              (pBVar1,(Id)topLevelDecorations.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,BuiltIn,num);
    if ((num == BuiltInHelperInvocation) &&
       ((this->glslangIntermediate->useVulkanMemoryModel == false &&
        (0x105ff < (this->glslangIntermediate->spvVersion).spv)))) {
      spv::Builder::addDecoration
                (pBVar1,(Id)topLevelDecorations.
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data._M_start,DecorationVolatile,-1);
    }
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_51,iVar8) + 0x158))
                    ((long *)CONCAT44(extraout_var_51,iVar8));
  if (cVar6 == '\0') {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar22 = *(uint *)(CONCAT44(extraout_var_52,iVar8) + 8);
    if (((uVar22 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar22 & 0x1f) & 1) != 0)) goto LAB_0033ac05;
  }
  else {
LAB_0033ac05:
    typeQualifier.semanticName = (char *)0x0;
    typeQualifier._8_8_ = 0;
    typeQualifier._16_4_ = 0;
    typeQualifier.layoutOffset = 0;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_53,iVar8) + 0x58))
                        ((long *)CONCAT44(extraout_var_53,iVar8));
    TranslateMemoryDecoration
              (pTVar20,(vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&typeQualifier,
               this->glslangIntermediate->useVulkanMemoryModel);
    for (uVar22 = 0;
        (ulong)uVar22 < (ulong)(typeQualifier._8_8_ - (long)typeQualifier.semanticName >> 2);
        uVar22 = uVar22 + 1) {
      spv::Builder::addDecoration
                (pBVar1,(Id)topLevelDecorations.
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                 *(Decoration *)(typeQualifier.semanticName + (ulong)uVar22 * 4),-1);
    }
    std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
              ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)&typeQualifier);
  }
  if (num == BuiltInLayer) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(char *)(CONCAT44(extraout_var_54,iVar8) + 0x30) == '\x01') {
      spv::Builder::addDecoration
                (pBVar1,(Id)topLevelDecorations.
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data._M_start,DecorationViewportRelativeNV,-1
                );
      spv::Builder::addCapability(pBVar1,CapabilityShaderViewportMaskNV);
      spv::Builder::addExtension(pBVar1,"SPV_NV_viewport_array2");
    }
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(int *)(CONCAT44(extraout_var_55,iVar8) + 0x34) != -0x800) {
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar9,DecorationSecondaryViewportRelativeNV,
                 *(int *)(CONCAT44(extraout_var_56,iVar8) + 0x34));
      pcVar24 = "SPV_NV_stereo_view_rendering";
      CVar23 = CapabilityShaderStereoViewNV;
LAB_0033ad59:
      spv::Builder::addCapability(pBVar1,CVar23);
      spv::Builder::addExtension(pBVar1,pcVar24);
    }
  }
  else if (num == BuiltInSampleMask) {
    bVar7 = this->glslangIntermediate->layoutOverrideCoverage;
    DVar13 = DecorationMax;
    if (bVar7 != false) {
      DVar13 = DecorationOverrideCoverageNV;
    }
    spv::Builder::addDecoration
              (pBVar1,(Id)topLevelDecorations.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DVar13,-1);
    if (bVar7 != false) {
      pcVar24 = "SPV_NV_sample_mask_override_coverage";
      CVar23 = CapabilitySampleMaskOverrideCoverageNV;
      goto LAB_0033ad59;
    }
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if (*(char *)(CONCAT44(extraout_var_57,iVar8) + 0x2f) == '\x01') {
    spv::Builder::addDecoration
              (pBVar1,(Id)topLevelDecorations.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPassthroughNV,-1);
    spv::Builder::addCapability(pBVar1,CapabilityGeometryShaderPassthroughNV);
    spv::Builder::addExtension(pBVar1,"SPV_NV_geometry_shader_passthrough");
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(byte *)(CONCAT44(extraout_var_58,iVar8) + 0xc) & 0x80) != 0) {
    spv::Builder::addDecoration
              (pBVar1,(Id)topLevelDecorations.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPerVertexKHR,-1);
    spv::Builder::addCapability(pBVar1,CapabilityFragmentBarycentricKHR);
    spv::Builder::addExtension(pBVar1,"SPV_NV_fragment_shader_barycentric");
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(byte *)(CONCAT44(extraout_var_59,iVar8) + 0xd) & 1) != 0) {
    spv::Builder::addDecoration
              (pBVar1,(Id)topLevelDecorations.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPerVertexKHR,-1);
    spv::Builder::addCapability(pBVar1,CapabilityFragmentBarycentricKHR);
    spv::Builder::addExtension(pBVar1,"SPV_KHR_fragment_shader_barycentric");
  }
  if (this->glslangIntermediate->hlslFunctionality1 == true) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar21 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_60,iVar8) + 0x58))
                                ((long *)CONCAT44(extraout_var_60,iVar8));
    if (*plVar21 != 0) {
      spv::Builder::addExtension(pBVar1,"SPV_GOOGLE_hlsl_functionality1");
      IVar9 = (Id)topLevelDecorations.
                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      puVar19 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_61,iVar8) + 0x58))
                          ((long *)CONCAT44(extraout_var_61,iVar8));
      spv::Builder::addDecoration(pBVar1,IVar9,DecorationHlslSemanticGOOGLE,(char *)*puVar19);
    }
  }
  iVar8 = (*(symbol->super_TIntermTyped).type._vptr_TType[7])(&(symbol->super_TIntermTyped).type);
  if (iVar8 == 0x12) {
    IVar9 = (Id)topLevelDecorations.
                super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_62,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_62,iVar8));
    spv::Builder::addDecoration
              (pBVar1,IVar9,AliasedPointer - ((*(ulong *)(lVar18 + 8) >> 0x2e & 1) != 0),-1);
  }
  iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_63,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_63,iVar8));
  if (*(long *)(lVar18 + 0x40) != 0) {
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    applySpirvDecorate(this,(TType *)CONCAT44(extraout_var_64,iVar8),
                       (Id)topLevelDecorations.
                           super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                           _M_impl.super__Vector_impl_data._M_start,(optional<int>)0x0);
  }
LAB_0033af14:
  return (Id)topLevelDecorations.
             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
             super__Vector_impl_data._M_start;
}

Assistant:

spv::Id TGlslangToSpvTraverser::getSymbolId(const glslang::TIntermSymbol* symbol)
{
    auto iter = symbolValues.find(symbol->getId());
    spv::Id id;
    if (symbolValues.end() != iter) {
        id = iter->second;
        return id;
    }

    // it was not found, create it
    spv::BuiltIn builtIn = TranslateBuiltInDecoration(symbol->getQualifier().builtIn, false);
    auto forcedType = getForcedType(symbol->getQualifier().builtIn, symbol->getType());

    // There are pairs of symbols that map to the same SPIR-V built-in:
    // gl_ObjectToWorldEXT and gl_ObjectToWorld3x4EXT, and gl_WorldToObjectEXT
    // and gl_WorldToObject3x4EXT. SPIR-V forbids having two OpVariables
    // with the same BuiltIn in the same storage class, so we must re-use one.
    const bool mayNeedToReuseBuiltIn =
        builtIn == spv::BuiltInObjectToWorldKHR ||
        builtIn == spv::BuiltInWorldToObjectKHR;

    if (mayNeedToReuseBuiltIn) {
        auto iter = builtInVariableIds.find(uint32_t(builtIn));
        if (builtInVariableIds.end() != iter) {
            id = iter->second;
            symbolValues[symbol->getId()] = id;
            if (forcedType.second != spv::NoType)
                forceType[id] = forcedType.second;
            return id;
        }
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return 0;
    }

    id = createSpvVariable(symbol, forcedType.first);

    if (mayNeedToReuseBuiltIn) {
        builtInVariableIds.insert({uint32_t(builtIn), id});
    }

    symbolValues[symbol->getId()] = id;
    if (forcedType.second != spv::NoType)
        forceType[id] = forcedType.second;

    if (symbol->getBasicType() != glslang::EbtBlock) {
        builder.addDecoration(id, TranslatePrecisionDecoration(symbol->getType()));
        builder.addDecoration(id, TranslateInterpolationDecoration(symbol->getType().getQualifier()));
        builder.addDecoration(id, TranslateAuxiliaryStorageDecoration(symbol->getType().getQualifier()));
        addMeshNVDecoration(id, /*member*/ -1, symbol->getType().getQualifier());
        if (symbol->getQualifier().hasComponent())
            builder.addDecoration(id, spv::DecorationComponent, symbol->getQualifier().layoutComponent);
        if (symbol->getQualifier().hasIndex())
            builder.addDecoration(id, spv::DecorationIndex, symbol->getQualifier().layoutIndex);
        if (symbol->getType().getQualifier().hasSpecConstantId())
            builder.addDecoration(id, spv::DecorationSpecId, symbol->getType().getQualifier().layoutSpecConstantId);
        // atomic counters use this:
        if (symbol->getQualifier().hasOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutOffset);
    }

    if (symbol->getQualifier().hasLocation()) {
        if (!(glslangIntermediate->isRayTracingStage() &&
              (glslangIntermediate->IsRequestedExtension(glslang::E_GL_EXT_ray_tracing) ||
               glslangIntermediate->IsRequestedExtension(glslang::E_GL_NV_shader_invocation_reorder))
              && (builder.getStorageClass(id) == spv::StorageClassRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassHitObjectAttributeNV))) {
            // Location values are used to link TraceRayKHR/ExecuteCallableKHR/HitObjectGetAttributesNV
            // to corresponding variables but are not valid in SPIRV since they are supported only
            // for Input/Output Storage classes.
            builder.addDecoration(id, spv::DecorationLocation, symbol->getQualifier().layoutLocation);
        }
    }

    builder.addDecoration(id, TranslateInvariantDecoration(symbol->getType().getQualifier()));
    if (symbol->getQualifier().hasStream() && glslangIntermediate->isMultiStream()) {
        builder.addCapability(spv::CapabilityGeometryStreams);
        builder.addDecoration(id, spv::DecorationStream, symbol->getQualifier().layoutStream);
    }
    if (symbol->getQualifier().hasSet())
        builder.addDecoration(id, spv::DecorationDescriptorSet, symbol->getQualifier().layoutSet);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationDescriptorSet, 0);
    }
    if (symbol->getQualifier().hasBinding())
        builder.addDecoration(id, spv::DecorationBinding, symbol->getQualifier().layoutBinding);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationBinding, 0);
    }
    if (symbol->getQualifier().hasAttachment())
        builder.addDecoration(id, spv::DecorationInputAttachmentIndex, symbol->getQualifier().layoutAttachment);
    if (glslangIntermediate->getXfbMode()) {
        builder.addCapability(spv::CapabilityTransformFeedback);
        if (symbol->getQualifier().hasXfbBuffer()) {
            builder.addDecoration(id, spv::DecorationXfbBuffer, symbol->getQualifier().layoutXfbBuffer);
            unsigned stride = glslangIntermediate->getXfbStride(symbol->getQualifier().layoutXfbBuffer);
            if (stride != glslang::TQualifier::layoutXfbStrideEnd)
                builder.addDecoration(id, spv::DecorationXfbStride, stride);
        }
        if (symbol->getQualifier().hasXfbOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutXfbOffset);
    }

    // add built-in variable decoration
    if (builtIn != spv::BuiltInMax) {
        // WorkgroupSize deprecated in spirv1.6
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6 ||
            builtIn != spv::BuiltInWorkgroupSize)
            builder.addDecoration(id, spv::DecorationBuiltIn, (int)builtIn);
    }

    // Add volatile decoration to HelperInvocation for spirv1.6 and beyond
    if (builtIn == spv::BuiltInHelperInvocation &&
        !glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        builder.addDecoration(id, spv::DecorationVolatile);
    }

    // Subgroup builtins which have input storage class are volatile for ray tracing stages.
    if (symbol->getType().isImage() || symbol->getQualifier().isPipeInput()) {
        std::vector<spv::Decoration> memory;
        TranslateMemoryDecoration(symbol->getType().getQualifier(), memory,
            glslangIntermediate->usingVulkanMemoryModel());
        for (unsigned int i = 0; i < memory.size(); ++i)
            builder.addDecoration(id, memory[i]);
    }

    if (builtIn == spv::BuiltInSampleMask) {
          spv::Decoration decoration;
          // GL_NV_sample_mask_override_coverage extension
          if (glslangIntermediate->getLayoutOverrideCoverage())
              decoration = (spv::Decoration)spv::DecorationOverrideCoverageNV;
          else
              decoration = (spv::Decoration)spv::DecorationMax;
        builder.addDecoration(id, decoration);
        if (decoration != spv::DecorationMax) {
            builder.addCapability(spv::CapabilitySampleMaskOverrideCoverageNV);
            builder.addExtension(spv::E_SPV_NV_sample_mask_override_coverage);
        }
    }
    else if (builtIn == spv::BuiltInLayer) {
        // SPV_NV_viewport_array2 extension
        if (symbol->getQualifier().layoutViewportRelative) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationViewportRelativeNV);
            builder.addCapability(spv::CapabilityShaderViewportMaskNV);
            builder.addExtension(spv::E_SPV_NV_viewport_array2);
        }
        if (symbol->getQualifier().layoutSecondaryViewportRelativeOffset != -2048) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationSecondaryViewportRelativeNV,
                                  symbol->getQualifier().layoutSecondaryViewportRelativeOffset);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
        }
    }

    if (symbol->getQualifier().layoutPassthrough) {
        builder.addDecoration(id, spv::DecorationPassthroughNV);
        builder.addCapability(spv::CapabilityGeometryShaderPassthroughNV);
        builder.addExtension(spv::E_SPV_NV_geometry_shader_passthrough);
    }
    if (symbol->getQualifier().pervertexNV) {
        builder.addDecoration(id, spv::DecorationPerVertexNV);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
    }

    if (symbol->getQualifier().pervertexEXT) {
        builder.addDecoration(id, spv::DecorationPerVertexKHR);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
    }

    if (glslangIntermediate->getHlslFunctionality1() && symbol->getType().getQualifier().semanticName != nullptr) {
        builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
        builder.addDecoration(id, (spv::Decoration)spv::DecorationHlslSemanticGOOGLE,
                              symbol->getType().getQualifier().semanticName);
    }

    if (symbol->isReference()) {
        builder.addDecoration(id, symbol->getType().getQualifier().restrict ?
            spv::DecorationRestrictPointerEXT : spv::DecorationAliasedPointerEXT);
    }

    // Add SPIR-V decorations (GL_EXT_spirv_intrinsics)
    if (symbol->getType().getQualifier().hasSpirvDecorate())
        applySpirvDecorate(symbol->getType(), id, {});

    return id;
}